

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void GETTOPVAL(char *string)

{
  LispPTR LVar1;
  size_t sVar2;
  long lVar3;
  DLword **ppDVar4;
  
  sVar2 = strlen(string);
  LVar1 = make_atom(string,0,(DLword)sVar2);
  if (LVar1 != 0xffffffff) {
    if ((LVar1 & 0xfff0000) == 0) {
      ppDVar4 = &AtomSpace;
      lVar3 = (long)(int)(LVar1 * 5) << 2;
    }
    else {
      if ((LVar1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar1);
      }
      ppDVar4 = &Lisp_world;
      lVar3 = (ulong)LVar1 * 2;
    }
    print(*(LispPTR *)((long)*ppDVar4 + lVar3 + 4));
    return;
  }
  printf("\'%s\': no such symbol.\n",string);
  return;
}

Assistant:

void GETTOPVAL(char *string) {
  int index;
  LispPTR *cell68k;

  index = MAKEATOM(string);
  if (index != -1) /* Only print if there's such an atom */
  {
    cell68k = (LispPTR *)GetVALCELL68k(index);
    print(*cell68k);
  } else
    printf("'%s': no such symbol.\n", string);
}